

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

int anon_unknown.dwarf_f4997::MyItem::CompareWithSortSpecs(void *lhs,void *rhs)

{
  undefined4 *puVar1;
  int local_44;
  int delta;
  ImGuiTableColumnSortSpecs *sort_spec;
  int n;
  MyItem *b;
  MyItem *a;
  void *rhs_local;
  void *lhs_local;
  
  sort_spec._4_4_ = 0;
  while( true ) {
    if ((int)(anonymous_namespace)::MyItem::s_current_sort_specs[1] <= sort_spec._4_4_) {
      return *lhs - *rhs;
    }
    puVar1 = (undefined4 *)
             (*(anonymous_namespace)::MyItem::s_current_sort_specs + (long)sort_spec._4_4_ * 0xc);
    switch(*puVar1) {
    case 0:
      local_44 = *lhs - *rhs;
      break;
    case 1:
      local_44 = strcmp(*(char **)((long)lhs + 8),*(char **)((long)rhs + 8));
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                    ,0xde0,
                    "static int (anonymous namespace)::MyItem::CompareWithSortSpecs(const void *, const void *)"
                   );
    case 3:
      local_44 = *(int *)((long)lhs + 0x10) - *(int *)((long)rhs + 0x10);
      break;
    case 4:
      local_44 = strcmp(*(char **)((long)lhs + 8),*(char **)((long)rhs + 8));
    }
    if (0 < local_44) break;
    if (local_44 < 0) {
      if (*(char *)(puVar1 + 2) != '\x01') {
        return 1;
      }
      return -1;
    }
    sort_spec._4_4_ = sort_spec._4_4_ + 1;
  }
  if (*(char *)(puVar1 + 2) != '\x01') {
    return -1;
  }
  return 1;
}

Assistant:

CompareWithSortSpecs(const void* lhs, const void* rhs)
    {
        const MyItem* a = (const MyItem*)lhs;
        const MyItem* b = (const MyItem*)rhs;
        for (int n = 0; n < s_current_sort_specs->SpecsCount; n++)
        {
            // Here we identify columns using the ColumnUserID value that we ourselves passed to TableSetupColumn()
            // We could also choose to identify columns based on their index (sort_spec->ColumnIndex), which is simpler!
            const ImGuiTableColumnSortSpecs* sort_spec = &s_current_sort_specs->Specs[n];
            int delta = 0;
            switch (sort_spec->ColumnUserID)
            {
            case MyItemColumnID_ID:             delta = (a->ID - b->ID);                break;
            case MyItemColumnID_Name:           delta = (strcmp(a->Name, b->Name));     break;
            case MyItemColumnID_Quantity:       delta = (a->Quantity - b->Quantity);    break;
            case MyItemColumnID_Description:    delta = (strcmp(a->Name, b->Name));     break;
            default: IM_ASSERT(0); break;
            }
            if (delta > 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? +1 : -1;
            if (delta < 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? -1 : +1;
        }

        // qsort() is instable so always return a way to differenciate items.
        // Your own compare function may want to avoid fallback on implicit sort specs e.g. a Name compare if it wasn't already part of the sort specs.
        return (a->ID - b->ID);
    }